

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
SummizerTestGlobal1_ExceptionOnCallWithoutExpect_Test::TestBody
          (SummizerTestGlobal1_ExceptionOnCallWithoutExpect_Test *this)

{
  bool bVar1;
  AssertHelper AStack_18;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      sum1(0);
    }
  }
  testing::Message::Message((Message *)&local_10);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_18,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/sample/main.cpp"
             ,0xae,"Expected: sum1(0) throws an exception.\n  Actual: it doesn\'t.");
  testing::internal::AssertHelper::operator=(&AStack_18,(Message *)&local_10);
  testing::internal::AssertHelper::~AssertHelper(&AStack_18);
  if (local_10._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_10._M_head_impl + 8))();
  }
  return;
}

Assistant:

TEST(SummizerTestGlobal1, ExceptionOnCallWithoutExpect)
{
    ASSERT_ANY_THROW(sum1(0));
}